

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_asn1.c
# Opt level: O0

int ec_asn1_group2curve(EC_GROUP *group,X9_62_CURVE *curve)

{
  int iVar1;
  EC_GROUP *group_00;
  ulong uVar2;
  ASN1_BIT_STRING *pAVar3;
  long *in_RSI;
  EC_GROUP *in_RDI;
  size_t len;
  uchar *b_buf;
  uchar *a_buf;
  BIGNUM *tmp_2;
  BIGNUM *tmp_1;
  int ok;
  int len_00;
  BN_CTX *in_stack_ffffffffffffffb8;
  BIGNUM *b;
  BIGNUM *a;
  BIGNUM *p;
  int local_1c;
  
  local_1c = 0;
  p = (BIGNUM *)0x0;
  a = (BIGNUM *)0x0;
  b = (BIGNUM *)0x0;
  if ((((in_RDI == (EC_GROUP *)0x0) || (in_RSI == (long *)0x0)) || (*in_RSI == 0)) ||
     (in_RSI[1] == 0)) {
    return 0;
  }
  group_00 = (EC_GROUP *)BN_new();
  if ((group_00 == (EC_GROUP *)0x0) || (p = BN_new(), p == (BIGNUM *)0x0)) {
    ERR_new();
    ERR_set_debug((char *)p,(int)((ulong)a >> 0x20),(char *)b);
    ERR_set_error(0x10,0xc0100,(char *)0x0);
  }
  else {
    iVar1 = EC_GROUP_get_curve(group_00,(BIGNUM *)p,a,b,in_stack_ffffffffffffffb8);
    if (iVar1 == 0) {
      ERR_new();
      ERR_set_debug((char *)p,(int)((ulong)a >> 0x20),(char *)b);
      ERR_set_error(0x10,0x80010,(char *)0x0);
    }
    else {
      iVar1 = EC_GROUP_get_degree(in_RDI);
      uVar2 = (long)iVar1 + 7U >> 3;
      a = (BIGNUM *)CRYPTO_malloc((int)uVar2,"crypto/ec/ec_asn1.c",0x150);
      if ((a == (BIGNUM *)0x0) ||
         (b = (BIGNUM *)CRYPTO_malloc((int)uVar2,"crypto/ec/ec_asn1.c",0x151), b == (BIGNUM *)0x0))
      {
        ERR_new();
        ERR_set_debug((char *)p,(int)((ulong)a >> 0x20),(char *)b);
        ERR_set_error(0x10,0xc0100,(char *)0x0);
      }
      else {
        iVar1 = BN_bn2binpad(a,(uchar *)b,(int)(uVar2 >> 0x20));
        if (-1 < iVar1) {
          iVar1 = BN_bn2binpad(a,(uchar *)b,(int)(uVar2 >> 0x20));
          len_00 = (int)uVar2;
          if (-1 < iVar1) {
            iVar1 = ASN1_OCTET_STRING_set((ASN1_OCTET_STRING *)*in_RSI,(uchar *)a,len_00);
            if ((iVar1 == 0) ||
               (iVar1 = ASN1_OCTET_STRING_set((ASN1_OCTET_STRING *)in_RSI[1],(uchar *)b,len_00),
               iVar1 == 0)) {
              ERR_new();
              ERR_set_debug((char *)p,(int)((ulong)a >> 0x20),(char *)b);
              ERR_set_error(0x10,0x8000d,(char *)0x0);
            }
            else {
              if (*(long *)(in_RDI + 0x30) == 0) {
                ASN1_BIT_STRING_free((ASN1_BIT_STRING *)in_RSI[2]);
                in_RSI[2] = 0;
              }
              else {
                if (in_RSI[2] == 0) {
                  pAVar3 = ASN1_BIT_STRING_new();
                  in_RSI[2] = (long)pAVar3;
                  if (pAVar3 == (ASN1_BIT_STRING *)0x0) {
                    ERR_new();
                    ERR_set_debug((char *)p,(int)((ulong)a >> 0x20),(char *)b);
                    ERR_set_error(0x10,0xc0100,(char *)0x0);
                    goto LAB_002390ec;
                  }
                }
                *(ulong *)(in_RSI[2] + 0x10) = *(ulong *)(in_RSI[2] + 0x10) & 0xfffffffffffffff0;
                *(ulong *)(in_RSI[2] + 0x10) = *(ulong *)(in_RSI[2] + 0x10) | 8;
                iVar1 = ASN1_BIT_STRING_set((ASN1_BIT_STRING *)in_RSI[2],*(uchar **)(in_RDI + 0x30),
                                            (int)*(undefined8 *)(in_RDI + 0x38));
                if (iVar1 == 0) {
                  ERR_new();
                  ERR_set_debug((char *)p,(int)((ulong)a >> 0x20),(char *)b);
                  ERR_set_error(0x10,0x8000d,(char *)0x0);
                  goto LAB_002390ec;
                }
              }
              local_1c = 1;
            }
            goto LAB_002390ec;
          }
        }
        ERR_new();
        ERR_set_debug((char *)p,(int)((ulong)a >> 0x20),(char *)b);
        ERR_set_error(0x10,0x80003,(char *)0x0);
      }
    }
  }
LAB_002390ec:
  CRYPTO_free(a);
  CRYPTO_free(b);
  BN_free((BIGNUM *)group_00);
  BN_free(p);
  return local_1c;
}

Assistant:

static int ec_asn1_group2curve(const EC_GROUP *group, X9_62_CURVE *curve)
{
    int ok = 0;
    BIGNUM *tmp_1 = NULL, *tmp_2 = NULL;
    unsigned char *a_buf = NULL, *b_buf = NULL;
    size_t len;

    if (!group || !curve || !curve->a || !curve->b)
        return 0;

    if ((tmp_1 = BN_new()) == NULL || (tmp_2 = BN_new()) == NULL) {
        ERR_raise(ERR_LIB_EC, ERR_R_MALLOC_FAILURE);
        goto err;
    }

    /* get a and b */
    if (!EC_GROUP_get_curve(group, NULL, tmp_1, tmp_2, NULL)) {
        ERR_raise(ERR_LIB_EC, ERR_R_EC_LIB);
        goto err;
    }

    /*
     * Per SEC 1, the curve coefficients must be padded up to size. See C.2's
     * definition of Curve, C.1's definition of FieldElement, and 2.3.5's
     * definition of how to encode the field elements.
     */
    len = ((size_t)EC_GROUP_get_degree(group) + 7) / 8;
    if ((a_buf = OPENSSL_malloc(len)) == NULL
        || (b_buf = OPENSSL_malloc(len)) == NULL) {
        ERR_raise(ERR_LIB_EC, ERR_R_MALLOC_FAILURE);
        goto err;
    }
    if (BN_bn2binpad(tmp_1, a_buf, len) < 0
        || BN_bn2binpad(tmp_2, b_buf, len) < 0) {
        ERR_raise(ERR_LIB_EC, ERR_R_BN_LIB);
        goto err;
    }

    /* set a and b */
    if (!ASN1_OCTET_STRING_set(curve->a, a_buf, len)
        || !ASN1_OCTET_STRING_set(curve->b, b_buf, len)) {
        ERR_raise(ERR_LIB_EC, ERR_R_ASN1_LIB);
        goto err;
    }

    /* set the seed (optional) */
    if (group->seed) {
        if (!curve->seed)
            if ((curve->seed = ASN1_BIT_STRING_new()) == NULL) {
                ERR_raise(ERR_LIB_EC, ERR_R_MALLOC_FAILURE);
                goto err;
            }
        curve->seed->flags &= ~(ASN1_STRING_FLAG_BITS_LEFT | 0x07);
        curve->seed->flags |= ASN1_STRING_FLAG_BITS_LEFT;
        if (!ASN1_BIT_STRING_set(curve->seed, group->seed,
                                 (int)group->seed_len)) {
            ERR_raise(ERR_LIB_EC, ERR_R_ASN1_LIB);
            goto err;
        }
    } else {
        ASN1_BIT_STRING_free(curve->seed);
        curve->seed = NULL;
    }

    ok = 1;

 err:
    OPENSSL_free(a_buf);
    OPENSSL_free(b_buf);
    BN_free(tmp_1);
    BN_free(tmp_2);
    return ok;
}